

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::~MeshEdgebreakerTraversalPredictiveEncoder
          (MeshEdgebreakerTraversalPredictiveEncoder *this)

{
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->predictions_).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>);
  MeshEdgebreakerTraversalEncoder::~MeshEdgebreakerTraversalEncoder
            (&this->super_MeshEdgebreakerTraversalEncoder);
  return;
}

Assistant:

MeshEdgebreakerTraversalPredictiveEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        num_split_symbols_(0),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0) {}